

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

int test_twin_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool _Var1;
  IOTHUB_CLIENT_RESULT IVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l_3;
  tickcounter_ms_t tStack_50;
  _Bool continue_run;
  tickcounter_ms_t start_time;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER p_Stack_20;
  int result;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  DEVICE_CREATION_TYPE create_type_local;
  BACK_COMPAT_HANDLE handle_local;
  
  p_Stack_20 = protocol;
  memset((void *)((long)&device_client + 1),0,3);
  l = (LOGGER_LOG)create_device_client(handle,create_type,p_Stack_20);
  if ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
             ,"test_twin_with_device_client",0x2eb,1,"Failure creating davice client");
    }
    device_client._4_4_ = 0x2ec;
  }
  else {
    IVar2 = IoTHubDeviceClient_LL_SetConnectionStatusCallback
                      ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l,connection_status_callback,
                       (void *)((long)&device_client + 1));
    _Var1 = check_iothub_result(IVar2);
    if (_Var1) {
      IVar2 = IoTHubDeviceClient_LL_SetDeviceTwinCallback
                        ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l,device_twin_callback,
                         (void *)((long)&device_client + 1));
      _Var1 = check_iothub_result(IVar2);
      if (_Var1) {
        tickcounter_get_current_ms(handle->tick_cntr_handle,&stack0xffffffffffffffb0);
        device_client._4_4_ = 0x2ff;
        do {
          if ((device_client._3_1_ & 1) != 0) {
            if ((device_client._1_1_ & 1) != 0) {
              device_client._4_4_ = 0;
              break;
            }
            IVar2 = IoTHubDeviceClient_LL_GetTwinAsync
                              ((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l,device_twin_callback,
                               (void *)((long)&device_client + 1));
            _Var1 = check_iothub_result(IVar2);
            if (!_Var1) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                          ,"test_twin_with_device_client",0x30d,1,"Failure setting twin callback");
              }
              device_client._4_4_ = 0x30e;
              break;
            }
            device_client._1_1_ = device_client._3_1_ & 1;
            device_client._3_1_ = 0;
          }
          IoTHubDeviceClient_LL_DoWork((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l);
          _Var1 = is_operation_timed_out(handle->tick_cntr_handle,tStack_50,0x78);
        } while (((_Var1 ^ 0xffU) & 1) != 0);
      }
      else {
        start_time = (tickcounter_ms_t)xlogging_get_log_function();
        if ((LOGGER_LOG)start_time != (LOGGER_LOG)0x0) {
          (*(code *)start_time)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                     ,"test_twin_with_device_client",0x2f7,1,"Failure setting twin asynccallback");
        }
        device_client._4_4_ = 0x2f8;
      }
    }
    else {
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
               ,"test_twin_with_device_client",0x2f2,1,"Failure setting connection status callback")
        ;
      }
      device_client._4_4_ = 0x2f3;
    }
    IoTHubDeviceClient_LL_Destroy((IOTHUB_DEVICE_CLIENT_LL_HANDLE)l);
    if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
      IoTHubTransport_Destroy(handle->transport_handle);
    }
  }
  return device_client._4_4_;
}

Assistant:

int test_twin_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (!check_iothub_result(IoTHubDeviceClient_LL_SetDeviceTwinCallback(device_client, device_twin_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting twin asynccallback");
            result = __LINE__;
        }
        else
        {
            tickcounter_ms_t start_time;
            bool continue_run = true;
            (void)tickcounter_get_current_ms(handle->tick_cntr_handle, &start_time);
            result = __LINE__;
            do
            {
                if (bc_msg_ctx.twin_callback_recv)
                {
                    if (bc_msg_ctx.callback_recv)
                    {
                        // Second callback we have succeeded
                        result = 0;
                        continue_run = false;
                        break;
                    }
                    else if (!check_iothub_result(IoTHubDeviceClient_LL_GetTwinAsync(device_client, device_twin_callback, &bc_msg_ctx)))
                    {
                        LogError("Failure setting twin callback");
                        result = __LINE__;
                        break;
                    }
                    else
                    {
                        bc_msg_ctx.callback_recv = bc_msg_ctx.twin_callback_recv;
                        // Wait for the second callback to get called
                        bc_msg_ctx.twin_callback_recv = false;
                    }
                }
                IoTHubDeviceClient_LL_DoWork(device_client);
            } while (continue_run && !is_operation_timed_out(handle->tick_cntr_handle, start_time, MAX_OPERATION_TIMEOUT) );
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return result;
}